

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::DefaultPerThreadTestPartResultReporter::ReportTestPartResult
          (DefaultPerThreadTestPartResultReporter *this,TestPartResult *result)

{
  Mutex *this_00;
  UnitTestImpl *pUVar1;
  TestPartResultReporterInterface *pTVar2;
  
  pUVar1 = this->unit_test_;
  this_00 = &pUVar1->global_test_part_result_reporter_mutex_;
  MutexBase::Lock(&this_00->super_MutexBase);
  pTVar2 = pUVar1->global_test_part_result_repoter_;
  MutexBase::Unlock(&this_00->super_MutexBase);
  (*pTVar2->_vptr_TestPartResultReporterInterface[2])(pTVar2,result);
  return;
}

Assistant:

void DefaultPerThreadTestPartResultReporter::ReportTestPartResult(
    const TestPartResult& result) {
  unit_test_->GetGlobalTestPartResultReporter()->ReportTestPartResult(result);
}